

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::Contains(S2Loop *this,S2Point *p)

{
  bool bVar1;
  int iVar2;
  __int_type_conflict1 _Var3;
  undefined1 local_60 [8];
  Iterator it;
  S2Point *p_local;
  S2Loop *this_local;
  
  it.end_._8_8_ = p;
  bVar1 = MutableS2ShapeIndex::is_fresh(&this->index_);
  if ((!bVar1) && (bVar1 = S2LatLngRect::Contains(&this->bound_,(S2Point *)it.end_._8_8_), !bVar1))
  {
    return false;
  }
  iVar2 = MutableS2ShapeIndex::num_shape_ids(&this->index_);
  if (((iVar2 != 0) && (iVar2 = num_vertices(this), 0x20 < iVar2)) &&
     ((bVar1 = MutableS2ShapeIndex::is_fresh(&this->index_), bVar1 ||
      (_Var3 = std::__atomic_base<int>::operator++
                         (&(this->unindexed_contains_calls_).super___atomic_base<int>),
      _Var3 == 0x14)))) {
    MutableS2ShapeIndex::Iterator::Iterator((Iterator *)local_60,&this->index_,UNPOSITIONED);
    bVar1 = MutableS2ShapeIndex::Iterator::Locate((Iterator *)local_60,(S2Point *)it.end_._8_8_);
    if (bVar1) {
      this_local._7_1_ = Contains(this,(Iterator *)local_60,(S2Point *)it.end_._8_8_);
    }
    else {
      this_local._7_1_ = false;
    }
    MutableS2ShapeIndex::Iterator::~Iterator((Iterator *)local_60);
    return this_local._7_1_;
  }
  bVar1 = BruteForceContains(this,(S2Point *)it.end_._8_8_);
  return bVar1;
}

Assistant:

bool S2Loop::Contains(const S2Point& p) const {
  // NOTE(ericv): A bounds check slows down this function by about 50%.  It is
  // worthwhile only when it might allow us to delay building the index.
  if (!index_.is_fresh() && !bound_.Contains(p)) return false;

  // For small loops it is faster to just check all the crossings.  We also
  // use this method during loop initialization because InitOriginAndBound()
  // calls Contains() before InitIndex().  Otherwise, we keep track of the
  // number of calls to Contains() and only build the index when enough calls
  // have been made so that we think it is worth the effort.  Note that the
  // code below is structured so that if many calls are made in parallel only
  // one thread builds the index, while the rest continue using brute force
  // until the index is actually available.
  //
  // The constants below were tuned using the benchmarks.  It turns out that
  // building the index costs roughly 50x as much as Contains().  (The ratio
  // increases slowly from 46x with 64 points to 61x with 256k points.)  The
  // textbook approach to this problem would be to wait until the cumulative
  // time we would have saved with an index approximately equals the cost of
  // building the index, and then build it.  (This gives the optimal
  // competitive ratio of 2; look up "competitive algorithms" for details.)
  // We set the limit somewhat lower than this (20 rather than 50) because
  // building the index may be forced anyway by other API calls, and so we
  // want to err on the side of building it too early.

  static const int kMaxBruteForceVertices = 32;
  static const int kMaxUnindexedContainsCalls = 20;  // See notes above.
  if (index_.num_shape_ids() == 0 ||  // InitIndex() not called yet
      num_vertices() <= kMaxBruteForceVertices ||
      (!index_.is_fresh() &&
       ++unindexed_contains_calls_ != kMaxUnindexedContainsCalls)) {
    return BruteForceContains(p);
  }
  // Otherwise we look up the S2ShapeIndex cell containing this point.  Note
  // the index is built automatically the first time an iterator is created.
  MutableS2ShapeIndex::Iterator it(&index_);
  if (!it.Locate(p)) return false;
  return Contains(it, p);
}